

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_AddReferences
               (UA_Server *server,UA_Session *session,UA_AddReferencesRequest *request,
               UA_AddReferencesResponse *response)

{
  UA_StatusCode UVar1;
  UA_StatusCode *pUVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  
  sVar5 = request->referencesToAddSize;
  if (sVar5 == 0) {
    UVar1 = 0x800f0000;
  }
  else {
    pUVar2 = (UA_StatusCode *)malloc(sVar5 * 4);
    response->results = pUVar2;
    if (pUVar2 != (UA_StatusCode *)0x0) {
      response->resultsSize = sVar5;
      lVar4 = 0;
      for (uVar3 = 0; uVar3 < sVar5; uVar3 = uVar3 + 1) {
        UVar1 = addReference(server,session,
                             (UA_AddReferencesItem *)
                             ((long)&(request->referencesToAdd->sourceNodeId).namespaceIndex + lVar4
                             ));
        response->results[uVar3] = UVar1;
        sVar5 = response->resultsSize;
        lVar4 = lVar4 + 0x80;
      }
      return;
    }
    UVar1 = 0x80030000;
  }
  (response->responseHeader).serviceResult = UVar1;
  return;
}

Assistant:

void Service_AddReferences(UA_Server *server, UA_Session *session,
                           const UA_AddReferencesRequest *request,
                           UA_AddReferencesResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing AddReferencesRequest");
    if(request->referencesToAddSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_malloc(sizeof(UA_StatusCode) * request->referencesToAddSize);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->referencesToAddSize;

#ifndef UA_ENABLE_EXTERNAL_NAMESPACES
    for(size_t i = 0; i < response->resultsSize; ++i)
        response->results[i] =
            addReference(server, session, &request->referencesToAdd[i]);
#else
    size_t size = request->referencesToAddSize;
# ifdef NO_ALLOCA
    UA_Boolean isExternal[size];
    UA_UInt32 indices[size];
# else
    UA_Boolean *isExternal = UA_alloca(sizeof(UA_Boolean) * size);
    UA_UInt32 *indices = UA_alloca(sizeof(UA_UInt32) * size);
# endif /*NO_ALLOCA */
    memset(isExternal, false, sizeof(UA_Boolean) * size);
    for(size_t j = 0; j < server->externalNamespacesSize; ++j) {
        size_t indicesSize = 0;
        for(size_t i = 0;i < size;++i) {
            if(request->referencesToAdd[i].sourceNodeId.namespaceIndex
               != server->externalNamespaces[j].index)
                continue;
            isExternal[i] = true;
            indices[indicesSize] = (UA_UInt32)i;
            ++indicesSize;
        }
        if (indicesSize == 0)
            continue;
        UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
        ens->addReferences(ens->ensHandle, &request->requestHeader, request->referencesToAdd,
                           indices, (UA_UInt32)indicesSize, response->results, response->diagnosticInfos);
    }

    for(size_t i = 0; i < response->resultsSize; ++i) {
        if(!isExternal[i])
            response->results[i] =
                addReference(server, session, &request->referencesToAdd[i]);
    }
#endif
}